

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  short sVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long in_FS_OFFSET;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar7 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar7 == 0xff) {
    lVar12 = 0;
    do {
      lVar13 = lVar12;
      lVar12 = lVar13 + 1;
    } while (hdc->maxcode[lVar13 + 10] <= uVar14 >> 0x10);
    iVar9 = j->code_bits;
    if (lVar12 == 8) {
      j->code_bits = iVar9 + -0x10;
      uVar10 = 0xffffffff;
      goto LAB_00148d8c;
    }
    uVar10 = 0xffffffff;
    if (iVar9 < (int)(lVar13 + 10)) goto LAB_00148d8c;
    uVar10 = stbi__bmask[lVar13 + 10];
    iVar6 = hdc->delta[lVar13 + 10];
    j->code_bits = (iVar9 - (int)lVar12) + -9;
    j->code_buffer = uVar14 << ((byte)(lVar13 + 10) & 0x1f);
    uVar7 = (ulong)(int)((uVar14 >> (0x17U - (char)lVar12 & 0x1f) & uVar10) + iVar6);
  }
  else {
    bVar1 = hdc->size[uVar7];
    uVar10 = 0xffffffff;
    if (j->code_bits < (int)(uint)bVar1) goto LAB_00148d8c;
    j->code_buffer = uVar14 << (bVar1 & 0x1f);
    j->code_bits = j->code_bits - (uint)bVar1;
  }
  uVar10 = (uint)hdc->values[uVar7];
LAB_00148d8c:
  if (uVar10 < 0x10) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (uVar10 == 0) {
      iVar9 = 0;
    }
    else {
      if (j->code_bits < (int)uVar10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar14 = j->code_buffer;
      bVar1 = (byte)uVar10 & 0x1f;
      uVar5 = uVar14 << bVar1 | uVar14 >> 0x20 - bVar1;
      uVar3 = stbi__bmask[uVar10];
      j->code_buffer = ~uVar3 & uVar5;
      j->code_bits = j->code_bits - uVar10;
      iVar9 = 0;
      if (-1 < (int)uVar14) {
        iVar9 = stbi__jbias[uVar10];
      }
      iVar9 = iVar9 + (uVar5 & uVar3);
    }
    iVar9 = iVar9 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar9;
    *data = (short)iVar9 * *dequant;
    iVar9 = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar2 = fac[j->code_buffer >> 0x17];
      if (uVar2 == 0) {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar14 = j->code_buffer;
        uVar7 = (ulong)hac->fast[uVar14 >> 0x17];
        if (uVar7 == 0xff) {
          lVar12 = 0;
          do {
            lVar13 = lVar12;
            lVar12 = lVar13 + 1;
          } while (hac->maxcode[lVar13 + 10] <= uVar14 >> 0x10);
          iVar6 = j->code_bits;
          if (lVar12 == 8) {
            j->code_bits = iVar6 + -0x10;
            uVar10 = 0xffffffff;
          }
          else {
            uVar10 = 0xffffffff;
            if ((int)(lVar13 + 10) <= iVar6) {
              uVar10 = stbi__bmask[lVar13 + 10];
              iVar4 = hac->delta[lVar13 + 10];
              j->code_bits = (iVar6 - (int)lVar12) + -9;
              j->code_buffer = uVar14 << ((byte)(lVar13 + 10) & 0x1f);
              uVar7 = (ulong)(int)((uVar14 >> (0x17U - (char)lVar12 & 0x1f) & uVar10) + iVar4);
              goto LAB_00148fc2;
            }
          }
        }
        else {
          bVar1 = hac->size[uVar7];
          uVar10 = 0xffffffff;
          if ((int)(uint)bVar1 <= j->code_bits) {
            j->code_buffer = uVar14 << (bVar1 & 0x1f);
            j->code_bits = j->code_bits - (uint)bVar1;
LAB_00148fc2:
            uVar10 = (uint)hac->values[uVar7];
          }
        }
        if ((int)uVar10 < 0) {
          *(char **)(in_FS_OFFSET + -0x30) = "bad huffman code";
          cVar8 = '\x01';
        }
        else {
          uVar14 = uVar10 & 0xf;
          if (uVar14 == 0) {
            iVar6 = iVar9 + 0x10;
            if (uVar10 != 0xf0) {
              iVar6 = iVar9;
            }
            iVar9 = iVar6;
            cVar8 = (uVar10 != 0xf0) * '\x02';
          }
          else {
            lVar12 = (long)iVar9 + (ulong)(uVar10 >> 4);
            bVar1 = ""[lVar12];
            if (j->code_bits < (int)uVar14) {
              stbi__grow_buffer_unsafe(j);
            }
            uVar10 = j->code_buffer;
            uVar5 = uVar10 << (sbyte)uVar14 | uVar10 >> 0x20 - (sbyte)uVar14;
            uVar3 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 * 4));
            j->code_buffer = ~uVar3 & uVar5;
            j->code_bits = j->code_bits - uVar14;
            cVar8 = '\0';
            sVar11 = 0;
            if (-1 < (int)uVar10) {
              sVar11 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 * 4));
            }
            iVar9 = (int)lVar12 + 1;
            *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 (((ushort)uVar5 & (ushort)uVar3) + sVar11) *
                 *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          }
        }
      }
      else {
        lVar12 = (long)iVar9 + (ulong)(uVar2 >> 4 & 0xf);
        j->code_buffer = j->code_buffer << (sbyte)(uVar2 & 0xf);
        j->code_bits = j->code_bits - (uVar2 & 0xf);
        iVar9 = (int)lVar12 + 1;
        *(short *)((long)data + (ulong)((uint)""[lVar12] * 2)) =
             (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar12] * 2));
        cVar8 = '\0';
      }
      iVar6 = 1;
      if (cVar8 != '\0') {
        if (cVar8 == '\x02') {
          return 1;
        }
        goto LAB_001490c9;
      }
    } while (iVar9 < 0x40);
  }
  else {
    *(char **)(in_FS_OFFSET + -0x30) = "bad huffman code";
LAB_001490c9:
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}